

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O2

field_t * SEM_DefList(ast *node,int ins)

{
  int iVar1;
  ast *paVar2;
  ast *node_00;
  attr *a;
  field_t *pfVar3;
  field_t *pfVar4;
  field_t *pfVar5;
  
  if (node->type == -1) {
    pfVar3 = (field_t *)0x0;
  }
  else {
    paVar2 = child(node,1);
    node_00 = child(paVar2,1);
    paVar2 = child(paVar2,2);
    a = SEM_Specifier(node_00);
    pfVar3 = SEM_DecList(paVar2,a,ins);
    pfVar4 = pfVar3;
    do {
      pfVar5 = pfVar4;
      pfVar4 = pfVar5->next;
    } while (pfVar4 != (field_t *)0x0);
    paVar2 = child(node,2);
    pfVar4 = SEM_DefList(paVar2,ins);
    pfVar5->next = pfVar4;
    pfVar5 = pfVar3;
    if (pfVar4 != (field_t *)0x0 && ins == 0) {
      do {
        for (; pfVar5 != pfVar4; pfVar5 = pfVar5->next) {
          iVar1 = strcmp(pfVar4->name,pfVar5->name);
          if (iVar1 == 0) {
            paVar2 = child(node,2);
            semerror(0xf,paVar2->pos->first_line,semErrorMsg[0xf],pfVar4->name);
          }
        }
        pfVar4 = pfVar4->next;
        pfVar5 = pfVar3;
      } while (pfVar4 != (field_t *)0x0);
    }
  }
  return pfVar3;
}

Assistant:

static struct field_t* SEM_DefList(struct ast *node, int ins) {
    if (node->type == NullNode)
        return NULL;
    struct field_t *f = SEM_Def(child(node, 1), ins), *p = f, *q;
    while (p->next) {
        p = p->next;
    }
    p->next = SEM_DefList(child(node, 2), ins);
    p = p->next;
    if (!ins) {
        while (p) {
            q = f;
            while (q != p) {
                if (strcmp(p->name, q->name) == 0) {
                    SEMERROR(RedefinedField, child(node, 2), p->name);
                }
                q = q->next;
            }
            p = p->next;
        }
    }
    return f;
}